

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

node_t unop(int id,node_t right)

{
  int *piVar1;
  void *pvVar2;
  
  piVar1 = (int *)mmalloc(0x48);
  piVar1[1] = 0;
  piVar1[2] = 0;
  piVar1[4] = 0;
  piVar1[5] = 0;
  piVar1[6] = 0;
  piVar1[7] = 0;
  if (id == 0x2b) {
    id = 0x8d;
  }
  else if (id == 0x2d) {
    id = 0x8c;
  }
  *piVar1 = id;
  piVar1[1] = 4;
  piVar1[2] = 1;
  pvVar2 = mrealloc(*(void **)(piVar1 + 6),8);
  *(void **)(piVar1 + 6) = pvVar2;
  *(node_t *)((long)pvVar2 + (ulong)(piVar1[2] - 1) * 8) = right;
  *(int **)((long)right + 0x10) = piVar1;
  return piVar1;
}

Assistant:

node_t unop(int id, node_t right)
{
    _node_t* new = create_node();
    if (id == '+')
        new->id = POSITIVE;
    else if (id == '-')
        new->id = NEGATIVE;
    else
        new->id = id;
    new->type = UNOP;
    add_child(new, (_node_t*)right);
    return (node_t)new;
}